

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraCommands.cpp
# Opt level: O1

ResponseLine * __thiscall
DeselectGenericCommand::trigger(DeselectGenericCommand *this,string_view parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type *psVar4;
  long lVar5;
  ResponseLine *pRVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  undefined8 uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  size_type __dnew;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  size_type *local_70;
  size_type local_68;
  size_type local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  size_type local_30;
  
  lVar5 = IRCCommand::selected_server;
  pRVar6 = (ResponseLine *)operator_new(0x30);
  if (lVar5 == 0) {
    Jupiter::GenericCommand::ResponseLine::ResponseLine
              (pRVar6,0x24,"No IRC server is currently selected.",0);
    return pRVar6;
  }
  auVar10 = Jupiter::IRC::Client::getConfigSection();
  paVar2 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,auVar10._8_8_,auVar10._0_8_ + auVar10._8_8_);
  paVar3 = &local_90.field_2;
  local_30 = 0x15;
  local_90._M_dataplus._M_p = (pointer)paVar3;
  local_90._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_90,&local_30,0);
  local_90.field_2._M_allocated_capacity = local_30;
  builtin_strncpy(local_90._M_dataplus._M_p," has been deselected.",0x15);
  local_90._M_string_length = local_30;
  local_90._M_dataplus._M_p[local_30] = '\0';
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    uVar8 = local_50.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_30 + local_50._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar3) {
      uVar9 = local_30;
    }
    if (local_30 + local_50._M_string_length <= uVar9) {
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_90,0,0,local_50._M_dataplus._M_p,local_50._M_string_length);
      goto LAB_0010c0f5;
    }
  }
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_50,local_90._M_dataplus._M_p,local_30);
LAB_0010c0f5:
  local_70 = &local_60;
  psVar4 = (size_type *)(pbVar7->_M_dataplus)._M_p;
  paVar1 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4 == paVar1) {
    local_60 = paVar1->_M_allocated_capacity;
    uStack_58 = *(undefined4 *)((long)&pbVar7->field_2 + 8);
    uStack_54 = *(undefined4 *)((long)&pbVar7->field_2 + 0xc);
  }
  else {
    local_60 = paVar1->_M_allocated_capacity;
    local_70 = psVar4;
  }
  local_68 = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar7->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar6,&local_70,0);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  IRCCommand::selected_server = 0;
  IRCCommand::active_server = 0;
  return pRVar6;
}

Assistant:

Jupiter::GenericCommand::ResponseLine *DeselectGenericCommand::trigger(std::string_view parameters)
{
	if (IRCCommand::selected_server == nullptr)
		return new Jupiter::GenericCommand::ResponseLine("No IRC server is currently selected."sv, GenericCommand::DisplayType::PublicSuccess);

	Jupiter::GenericCommand::ResponseLine *ret = new Jupiter::GenericCommand::ResponseLine(std::string{IRCCommand::selected_server->getConfigSection()} + " has been deselected."s, GenericCommand::DisplayType::PublicSuccess);
	IRCCommand::selected_server = nullptr;
	IRCCommand::active_server = IRCCommand::selected_server;
	return ret;
}